

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_tools.cc
# Opt level: O0

void usage(void)

{
  std::operator<<((ostream *)&std::cout,
                  "\nThis program provides tools for counting the set of essentially different\nSudoku grids and sampling from this set with uniform probability.\n\nIt also supports sampling from the set of essentially different minimal\nSudoku puzzles with uniform conditional probability given clue count. The\nsampler is biased towards producing puzzles with fewer clues, but this\nbias is quantified and puzzles are produced along with weights that can\nbe used to adjust statistics if desired.\n\nTo achieve these goals we first enumerate all the essentially different\nconfigurations of the first band and stack of the board (leaving the 6x6\ncells at the bottom right unconstrained). For each of these configurations\nwe then use the solver to count the number of possible grid completions.\nFinally we use these counts to construct a table and index that allow mapping\nany of the 27704267971*2^7 grid classes to a configuration and solution offset.\n\nTo construct these tables use the command below. If you have downloaded\npre-generated tables you can skip this step and the next.\n\n  chunksize=$((36228 * 36228 / 64))\n  for i in {0..63}; do\n    build/grid_tools count_grids $(( i * chunksize )) $(( (i + 1) * chunksize )) > chunk.$i &\n  done\n  wait\n\nAdjust the parallelism used above as appropriate for your platform. On a\nThreadripper 2990WX with 64 processes this takes about 8 hours.\n\nNow make the tables, taking care to consume the chunks of counts in order:\n\n  build/grid_tools make_tables < <(cat chunk.{0..63})\n\nWith the generated tables and index in the current directory you can now get\nany numbered grid in range(27704267971*2^7), or you can sample grids randomly:\n\n  build/grid_tools list_grids <first_gird_id> [<limit>=1]\n  build/grid_tools sample_grids [<limit>=-1]\n\nYou can also sample minimal puzzles via a very slow rejection sampling procedure\nlike so:\n\n  build/grid_gools sample_puzzles [<limit>=-1]\n\n"
                 );
  exit(0);
}

Assistant:

void usage() {
    cout << R"USAGE(
This program provides tools for counting the set of essentially different
Sudoku grids and sampling from this set with uniform probability.

It also supports sampling from the set of essentially different minimal
Sudoku puzzles with uniform conditional probability given clue count. The
sampler is biased towards producing puzzles with fewer clues, but this
bias is quantified and puzzles are produced along with weights that can
be used to adjust statistics if desired.

To achieve these goals we first enumerate all the essentially different
configurations of the first band and stack of the board (leaving the 6x6
cells at the bottom right unconstrained). For each of these configurations
we then use the solver to count the number of possible grid completions.
Finally we use these counts to construct a table and index that allow mapping
any of the 27704267971*2^7 grid classes to a configuration and solution offset.

To construct these tables use the command below. If you have downloaded
pre-generated tables you can skip this step and the next.

  chunksize=$((36228 * 36228 / 64))
  for i in {0..63}; do
    build/grid_tools count_grids $(( i * chunksize )) $(( (i + 1) * chunksize )) > chunk.$i &
  done
  wait

Adjust the parallelism used above as appropriate for your platform. On a
Threadripper 2990WX with 64 processes this takes about 8 hours.

Now make the tables, taking care to consume the chunks of counts in order:

  build/grid_tools make_tables < <(cat chunk.{0..63})

With the generated tables and index in the current directory you can now get
any numbered grid in range(27704267971*2^7), or you can sample grids randomly:

  build/grid_tools list_grids <first_gird_id> [<limit>=1]
  build/grid_tools sample_grids [<limit>=-1]

You can also sample minimal puzzles via a very slow rejection sampling procedure
like so:

  build/grid_gools sample_puzzles [<limit>=-1]

)USAGE";
    exit(0);
}